

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

ULONG PAL_wcstoul(char16_t *nptr,char16_t **endptr,int base)

{
  char16_t c;
  char16_t *pcVar1;
  int iVar2;
  DWORD DVar3;
  char *lpMultiByteStr;
  ulong uVar4;
  int *piVar5;
  ULONG UVar6;
  char16_t *pcVar7;
  char *local_40;
  char *s_endptr;
  
  local_40 = (char *)0x0;
  s_endptr = (char *)endptr;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00312478;
  iVar2 = WideCharToMultiByte(0,0,nptr,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
  if (iVar2 == 0) {
    DVar3 = GetLastError();
    fprintf(_stderr,"] %s %s:%d","PAL_wcstoul",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
            ,0x2e9);
    fprintf(_stderr,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar3);
    SetLastError(0x57);
LAB_003123fa:
    lpMultiByteStr = (char *)0x0;
    UVar6 = 0;
  }
  else {
    lpMultiByteStr = (char *)PAL_malloc((long)iVar2);
    if (lpMultiByteStr == (char *)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00312478;
      SetLastError(8);
      goto LAB_003123fa;
    }
    iVar2 = WideCharToMultiByte(0,0,nptr,-1,lpMultiByteStr,iVar2,(LPCSTR)0x0,(LPBOOL)0x0);
    if (iVar2 == 0) {
      DVar3 = GetLastError();
      UVar6 = 0;
      fprintf(_stderr,"] %s %s:%d","PAL_wcstoul",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
              ,0x2fa);
      fprintf(_stderr,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar3);
      SetLastError(0x57);
    }
    else {
      uVar4 = strtoul(lpMultiByteStr,&local_40,base);
      pcVar7 = nptr;
      pcVar1 = nptr;
      if (uVar4 >> 0x20 != 0) {
        do {
          pcVar7 = pcVar1;
          c = *nptr;
          iVar2 = PAL_iswspace(c);
          nptr = pcVar7;
          pcVar1 = pcVar7 + 1;
        } while (iVar2 != 0);
        if (c != L'-') {
          piVar5 = __errno_location();
          *piVar5 = 0x22;
          uVar4 = 0xffffffff;
        }
      }
      UVar6 = (ULONG)uVar4;
      if (s_endptr != (char *)0x0) {
        *(char16_t **)s_endptr = pcVar7 + ((int)local_40 - (int)lpMultiByteStr);
      }
    }
  }
  PAL_free(lpMultiByteStr);
  if (PAL_InitializeChakraCoreCalled != false) {
    return UVar6;
  }
LAB_00312478:
  abort();
}

Assistant:

ULONG
__cdecl
PAL_wcstoul(
        const char16_t *nptr,
        char16_t **endptr,
        int base)
{
    char *s_nptr = 0;
    char *s_endptr = 0;
    unsigned long res;
    int size;
    DWORD dwLastError = 0;

    PERF_ENTRY(wcstoul);
    ENTRY("wcstoul (nptr=%p (%S), endptr=%p, base=%d)\n", nptr?nptr:W16_NULLSTRING, nptr?nptr:W16_NULLSTRING,
          endptr, base);

    size = WideCharToMultiByte(CP_ACP, 0, nptr, -1, NULL, 0, NULL, NULL);
    if (!size)
    {
        dwLastError = GetLastError();
        ASSERT("WideCharToMultiByte failed.  Error is %d\n", dwLastError);
        SetLastError(ERROR_INVALID_PARAMETER);
        res = 0;
        goto PAL_wcstoulExit;
    }
    s_nptr = (char *)PAL_malloc(size);
    if (!s_nptr)
    {
        ERROR("PAL_malloc failed\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        res = 0;
        goto PAL_wcstoulExit;
    }
    size = WideCharToMultiByte(CP_ACP, 0, nptr, -1, s_nptr, size, NULL, NULL);
    if (!size)
    {
        dwLastError = GetLastError();
        ASSERT("WideCharToMultiByte failed.  Error is %d\n", dwLastError);
        SetLastError(ERROR_INVALID_PARAMETER);
        res = 0;
        goto PAL_wcstoulExit;
    }

    res = strtoul(s_nptr, &s_endptr, base);

#ifdef BIT64
    if (res > _UI32_MAX)
    {
        char16_t wc = *nptr;
        while (PAL_iswspace(wc))
        {
            wc = *nptr++;
        }
        /* If the string represents a positive number that is greater than
           _UI32_MAX, set errno to ERANGE. Otherwise, don't set errno
           to match Windows behavior. */
        if (wc != '-')
        {
            res = _UI32_MAX;
            errno = ERANGE;
        }
    }
#endif

    /* only ASCII characters will be accepted by strtol, and those always get
       mapped to single-byte characters, so the first rejected character will
       have the same index in the multibyte and widechar strings */
    if( endptr )
    {
        size = s_endptr - s_nptr;
        *endptr = (char16_t *)&nptr[size];
    }

PAL_wcstoulExit:
    PAL_free(s_nptr);
    LOGEXIT("wcstoul returning unsigned long %lu\n", res);
    PERF_EXIT(wcstoul);

    /* When returning unsigned long res from this function, it will be
    implicitly cast to ULONG. This handles situations where a string that
    represents a negative number is passed in to wcstoul. The Windows
    behavior is analogous to taking the binary equivalent of the negative
    value and treating it as a positive number. Returning a ULONG from
    this function, as opposed to native unsigned long, allows us to match
    this behavior. The explicit case to ULONG below is used to silence any
    potential warnings due to the implicit casting.  */
    return (ULONG)res;
}